

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall
poly::
vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
::push_back_new_elem_w_storage_increase<custom::CustImpl>
          (vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
           *this)

{
  CustInterface *pCVar1;
  elem_ptr_pointer pvVar2;
  elem_ptr_const_pointer begin;
  void_pointer pvVar3;
  size_t sVar4;
  long v_2;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  elem_ptr_pointer pvVar9;
  long v_1;
  ulong uVar10;
  _Head_base<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
  _Var11;
  elem_ptr_pointer pvVar12;
  ulong uVar13;
  ulong max_align;
  vector<custom::CustInterface,_std::allocator<custom::CustInterface>,_custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>_>
  v;
  allocator_base<std::allocator<unsigned_char>_> local_58;
  vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
  *local_48;
  vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
  *pvStack_40;
  ulong local_38;
  poly_copy_descr local_30;
  
  pvVar9 = (elem_ptr_pointer)(this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  pvVar2 = this->_free_elem;
  uVar13 = (ulong)((long)this->_begin_storage - (long)pvVar9) >> 4 & 0xfffffffffffffffe;
  uVar13 = uVar13 + (uVar13 == 0);
  max_align = 8;
  if (8 < this->_align_max) {
    max_align = this->_align_max;
  }
  uVar10 = max_align;
  if (pvVar9 != pvVar2) {
    pvVar12 = pvVar9;
    do {
      uVar6 = (pvVar12->sf).first + (max_align - 1);
      uVar10 = (uVar10 - uVar6 % max_align) + uVar6;
      pvVar12 = pvVar12 + 1;
    } while (pvVar12 != pvVar2);
  }
  uVar7 = (max_align - (max_align + 7) % max_align) + 7;
  uVar6 = uVar7;
  if (pvVar9 != pvVar2) {
    lVar5 = (long)pvVar2 - (long)pvVar9 >> 5;
    uVar6 = (lVar5 + uVar10 + uVar7) / (lVar5 + 1U);
  }
  uVar8 = (long)pvVar2 - (long)pvVar9 >> 5;
  lVar5 = 0;
  if (uVar8 <= uVar13) {
    lVar5 = uVar13 - uVar8;
  }
  local_48 = (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
              *)0x0;
  pvStack_40 = (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
                *)0x0;
  local_58._storage =
       (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
        *)0x0;
  local_58._end_storage = (void_pointer)0x0;
  local_38 = 8;
  vector_impl::allocator_base<std::allocator<unsigned_char>_>::allocate
            (&local_58,uVar7 + uVar13 * 0x20 + uVar10 + lVar5 * uVar6);
  local_48 = (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
              *)local_58._storage;
  pvStack_40 = (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
                *)((long)local_58._storage + uVar13 * 0x20);
  begin = (elem_ptr_const_pointer)
          (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
  local_38 = max_align;
  poly_uninitialized_copy
            (&local_30,&local_58,local_58._storage,begin,this->_free_elem,begin + uVar13,max_align);
  local_48 = local_30.
             super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
             .
             super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
             ._M_head_impl;
  pvStack_40 = local_30.
               super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
               .
               super__Tuple_impl<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
               .
               super__Head_base<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
               ._M_head_impl;
  if ((local_30.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
       .
       super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
       ._M_head_impl !=
       local_30.
       super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
       .
       super__Tuple_impl<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
       .
       super__Head_base<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
       ._M_head_impl) && (7 < local_38)) {
    _Var11._M_head_impl =
         local_30.
         super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
         .
         super__Tuple_impl<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
         .
         super__Head_base<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
         ._M_head_impl;
    if (local_30.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
        ._M_head_impl !=
        (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
         *)local_58._storage) {
      _Var11._M_head_impl =
           (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
            *)((long)local_30.
                     super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
                     .
                     super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
                     ._M_head_impl[-1].ptr.first +
              local_30.
              super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
              .
              super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
              ._M_head_impl[-1].sf.first);
    }
    if ((void_pointer)
        ((long)_Var11._M_head_impl +
        (local_38 - ((long)_Var11._M_head_impl + (local_38 - 1)) % local_38) + 7) <=
        local_58._end_storage) {
      _Var11._M_head_impl =
           local_30.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
           .
           super__Tuple_impl<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
           .
           super__Head_base<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
           ._M_head_impl;
      if (local_30.
          super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
          .
          super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
          ._M_head_impl !=
          (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
           *)local_58._storage) {
        _Var11._M_head_impl =
             (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
              *)((long)local_30.
                       super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
                       .
                       super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
                       ._M_head_impl[-1].ptr.first +
                local_30.
                super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
                .
                super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
                ._M_head_impl[-1].sf.first);
      }
      lVar5 = (local_38 - 1) - ((local_38 - 1) + (long)_Var11._M_head_impl) % local_38;
      pCVar1 = (CustInterface *)((long)_Var11._M_head_impl + lVar5);
      *(undefined ***)((long)_Var11._M_head_impl + lVar5) = &PTR_accept_002bfa68;
      ((local_30.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
       ._M_head_impl)->ptr).first = pCVar1;
      ((local_30.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
       ._M_head_impl)->ptr).second = pCVar1;
      ((local_30.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
       ._M_head_impl)->sf).first = 8;
      ((local_30.
        super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
        .
        super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
       ._M_head_impl)->sf).second = 8;
      pvVar9 = (elem_ptr_pointer)
               (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage;
      (this->super_allocator_base<std::allocator<unsigned_char>_>)._storage = local_58._storage;
      pvVar3 = (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage;
      (this->super_allocator_base<std::allocator<unsigned_char>_>)._end_storage =
           local_58._end_storage;
      pvVar2 = this->_free_elem;
      this->_free_elem =
           local_30.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
           .
           super__Head_base<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
           ._M_head_impl + 1;
      pvStack_40 = (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
                    *)this->_begin_storage;
      this->_begin_storage =
           local_30.
           super__Tuple_impl<0UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
           .
           super__Tuple_impl<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_void_*>
           .
           super__Head_base<1UL,_poly::vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>_*,_false>
           ._M_head_impl;
      sVar4 = this->_align_max;
      this->_align_max = local_38;
      local_58._storage = pvVar9;
      local_58._end_storage = pvVar3;
      local_48 = pvVar2;
      local_38 = sVar4;
      for (; pvVar2 != pvVar9; pvVar9 = pvVar9 + 1) {
        (*((pvVar9->ptr).second)->_vptr_CustInterface[2])();
        (pvVar9->sf).first = 0;
        (pvVar9->sf).second = 0;
        (pvVar9->ptr).first = (void *)0x0;
        (pvVar9->ptr).second = (CustInterface *)0x0;
      }
      local_38 = 8;
      pvVar9 = (elem_ptr_pointer)local_58._storage;
      if (0x1f < (ulong)((long)pvStack_40 - (long)local_58._storage)) {
        do {
          (pvVar9->sf).first = 0;
          (pvVar9->sf).second = 0;
          (pvVar9->ptr).first = (void *)0x0;
          (pvVar9->ptr).second = (CustInterface *)0x0;
          pvVar9 = pvVar9 + 1;
        } while (pvVar9 != (elem_ptr_pointer)
                           ((long)&(((elem_ptr_pointer)local_58._storage)->ptr).first +
                           ((long)pvStack_40 - (long)local_58._storage & 0xffffffffffffffe0U)));
      }
      local_48 = (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
                  *)0x0;
      pvStack_40 = (vector_elem_ptr<custom::CustomCloningPolicyT<custom::CustInterface,_std::allocator<custom::CustInterface>_>,_std::allocator_traits<std::allocator<custom::CustInterface>_>_>
                    *)0x0;
      operator_delete(local_58._storage,(long)local_58._end_storage - (long)local_58._storage);
      local_58._storage = (void_pointer)0x0;
      local_58._end_storage = (void_pointer)0x0;
      operator_delete((void *)0x0,0);
      return;
    }
  }
  __assert_fail("can_construct_new_elem(s, a)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fecjanky[P]poly_vector/include/poly/vector.h"
                ,0x5a9,
                "void poly::vector<custom::CustInterface, std::allocator<custom::CustInterface>, custom::CustomCloningPolicyT<custom::CustInterface>>::push_back_new_elem(type_tag<T>, Args &&...) [IF = custom::CustInterface, Allocator = std::allocator<custom::CustInterface>, CloningPolicy = custom::CustomCloningPolicyT<custom::CustInterface>, T = custom::CustImpl, Args = <>]"
               );
}

Assistant:

inline void vector<I, A, C>::push_back_new_elem_w_storage_increase(
    type_tag<T> /* t */, Args&&... args)
{
    constexpr auto s                = sizeof(T);
    constexpr auto a                = alignof(T);
    constexpr auto noexcept_movable = interface_type_noexcept_movable::value;
    constexpr auto nothrow_ctor     = std::is_nothrow_constructible<T, Args...>::value;
    //////////////////////////////////////////
    const auto new_capacity = std::max(capacity() * 2, size_t(1));
    const auto sizes        = calculate_storage_size(new_capacity, s, a);
    vector v(allocator_traits::select_on_container_copy_construction(base().get_allocator_ref()));
    v.init_layout(sizes.first, new_capacity, sizes.second);
    push_back_new_elem_w_storage_increase_copy(
        v, std::integral_constant < bool, noexcept_movable&& nothrow_ctor > {});
    v.push_back_new_elem(type_tag<T> {}, std::forward<Args>(args)...);
    this->swap(v);
}